

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiprobe.cpp
# Opt level: O1

int main(void)

{
  undefined4 uVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  RtMidiIn *this;
  RtMidiOut *this_00;
  ulong uVar4;
  uint uVar5;
  string portName;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> apis;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  apiMap;
  char local_a1;
  long *local_a0;
  long local_98;
  long local_90 [2];
  RtMidiIn *local_80;
  void *local_78;
  void *pvStack_70;
  long local_68;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0._0_4_ = 1;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)&local_a0);
  std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0x103004);
  local_a0._0_4_ = 4;
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)&local_a0);
  std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0x103012);
  local_a0._0_4_ = 3;
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)&local_a0);
  std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0x103025);
  local_a0._0_4_ = 2;
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)&local_a0);
  std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0x103031);
  local_a0 = (long *)CONCAT44(local_a0._4_4_,5);
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)&local_a0);
  std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0x10303c);
  local_78 = (void *)0x0;
  pvStack_70 = (void *)0x0;
  local_68 = 0;
  RtMidi::getCompiledApi((vector *)&local_78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nCompiled APIs:\n",0x10);
  if (pvStack_70 != local_78) {
    uVar5 = 1;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      local_a0 = (long *)CONCAT44(local_a0._4_4_,*(undefined4 *)((long)local_78 + uVar4 * 4));
      pmVar2 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,(key_type *)&local_a0);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar4 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar4 < (ulong)((long)pvStack_70 - (long)local_78 >> 2));
  }
  local_80 = (RtMidiIn *)0x0;
  this = (RtMidiIn *)operator_new(0x10);
  local_a0 = local_90;
  local_80 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"RtMidi Input Client","");
  RtMidiIn::RtMidiIn(this,UNSPECIFIED,(string *)&local_a0,100);
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nCurrent input API: ",0x14);
  uVar1 = (**(code **)(**(long **)(local_80 + 8) + 0x10))();
  local_a0 = (long *)CONCAT44(local_a0._4_4_,uVar1);
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)&local_a0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  uVar5 = (**(code **)(*(long *)local_80 + 0x10))();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nThere are ",0xb);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," MIDI input sources available.\n",0x1f)
  ;
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      (**(code **)(*(long *)local_80 + 0x18))(&local_a0,local_80,uVar4 & 0xffffffff);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Input Port #",0xe)
      ;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_a0,local_98);
      local_a1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_a1,1);
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  this_00 = (RtMidiOut *)operator_new(0x10);
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"RtMidi Output Client","");
  RtMidiOut::RtMidiOut(this_00,UNSPECIFIED,(string *)&local_a0);
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nCurrent output API: ",0x15);
  uVar1 = (**(code **)(**(long **)(this_00 + 8) + 0x10))();
  local_a0 = (long *)CONCAT44(local_a0._4_4_,uVar1);
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)&local_a0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  uVar5 = (**(code **)(*(long *)this_00 + 0x10))(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nThere are ",0xb);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," MIDI output ports available.\n",0x1e);
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      (**(code **)(*(long *)this_00 + 0x18))(&local_a0,this_00,uVar4 & 0xffffffff);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Output Port #",0xf);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_a0,local_98);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  if (local_80 != (RtMidiIn *)0x0) {
    (**(code **)(*(long *)local_80 + 0x40))();
  }
  if (this_00 != (RtMidiOut *)0x0) {
    (**(code **)(*(long *)this_00 + 0x40))(this_00);
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return 0;
}

Assistant:

int main()
{
  // Create an api map.
  std::map<int, std::string> apiMap;
  apiMap[RtMidi::MACOSX_CORE] = "OS-X CoreMIDI";
  apiMap[RtMidi::WINDOWS_MM] = "Windows MultiMedia";
  apiMap[RtMidi::UNIX_JACK] = "Jack Client";
  apiMap[RtMidi::LINUX_ALSA] = "Linux ALSA";
  apiMap[RtMidi::RTMIDI_DUMMY] = "RtMidi Dummy";

  std::vector< RtMidi::Api > apis;
  RtMidi :: getCompiledApi( apis );

  std::cout << "\nCompiled APIs:\n";
  for ( unsigned int i=0; i<apis.size(); i++ )
    std::cout << "  " << apiMap[ apis[i] ] << std::endl;

  RtMidiIn  *midiin = 0;
  RtMidiOut *midiout = 0;

  try {

    // RtMidiIn constructor ... exception possible
    midiin = new RtMidiIn();

    std::cout << "\nCurrent input API: " << apiMap[ midiin->getCurrentApi() ] << std::endl;

    // Check inputs.
    unsigned int nPorts = midiin->getPortCount();
    std::cout << "\nThere are " << nPorts << " MIDI input sources available.\n";

    for ( unsigned i=0; i<nPorts; i++ ) {
      std::string portName = midiin->getPortName(i);
      std::cout << "  Input Port #" << i << ": " << portName << '\n';
    }

    // RtMidiOut constructor ... exception possible
    midiout = new RtMidiOut();

    std::cout << "\nCurrent output API: " << apiMap[ midiout->getCurrentApi() ] << std::endl;

    // Check outputs.
    nPorts = midiout->getPortCount();
    std::cout << "\nThere are " << nPorts << " MIDI output ports available.\n";

    for ( unsigned i=0; i<nPorts; i++ ) {
      std::string portName = midiout->getPortName(i);
      std::cout << "  Output Port #" << i << ": " << portName << std::endl;
    }
    std::cout << std::endl;

  } catch ( RtMidiError &error ) {
    error.printMessage();
  }

  delete midiin;
  delete midiout;

  return 0;
}